

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exhaustive-solver.hpp
# Opt level: O1

void __thiscall
baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,_float>::reserve
          (exhaustive_solver<baryonyx::itm::maximize_tag,_float> *this,size_t max_variables,
          size_t max_z_constraints)

{
  if (max_variables == 0) {
    exhaustive_solver<baryonyx::itm::maximize_tag,float>::reserve();
  }
  else if (max_z_constraints != 0) {
    std::
    vector<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,_float>::item,_std::allocator<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,_float>::item>_>
    ::reserve(&this->items,max_variables);
    std::vector<int,_std::allocator<int>_>::reserve
              (&this->flat_constraints,max_z_constraints * max_variables);
    std::vector<signed_char,_std::allocator<signed_char>_>::reserve(&this->walkers,max_variables);
    return;
  }
  exhaustive_solver<baryonyx::itm::maximize_tag,float>::reserve();
}

Assistant:

void reserve(std::size_t max_variables, std::size_t max_z_constraints)
    {
        bx_assert(max_variables > 0);
        bx_assert(max_z_constraints > 0);

        items.reserve(max_variables);
        flat_constraints.reserve(max_variables * max_z_constraints);
        walkers.reserve(max_variables);
    }